

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  ImportInfo *pIVar4;
  cmValue propval;
  cmGeneratorTarget *this_00;
  allocator<char> local_39;
  
  TVar2 = GetType(this);
  MVar3 = Undefined;
  if ((int)TVar2 < 3) {
    TVar2 = GetType(this);
    if (TVar2 == STATIC_LIBRARY) {
      MVar3 = Native;
    }
    else {
      bVar1 = IsImported(this);
      if (bVar1) {
        pIVar4 = GetImportInfo(this,config);
        MVar3 = Undefined;
        if (pIVar4 != (ImportInfo *)0x0) {
          MVar3 = pIVar4->Managed;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xffffffffffffffc8,"COMMON_LANGUAGE_RUNTIME",&local_39);
        propval = GetProperty(this,(string *)&stack0xffffffffffffffc8);
        this_00 = (cmGeneratorTarget *)&stack0xffffffffffffffc8;
        std::__cxx11::string::~string((string *)this_00);
        if (propval.Value == (string *)0x0) {
          bVar1 = IsCSharpOnly(this);
          MVar3 = (uint)bVar1 * 2 + Native;
        }
        else {
          MVar3 = CheckManagedType(this_00,propval.Value);
        }
      }
    }
  }
  return MVar3;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::GetManagedType(
  const std::string& config) const
{
  // Only libraries and executables can be managed targets.
  if (this->GetType() > cmStateEnums::SHARED_LIBRARY) {
    return ManagedType::Undefined;
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    return ManagedType::Native;
  }

  // Check imported target.
  if (this->IsImported()) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->Managed;
    }
    return ManagedType::Undefined;
  }

  // Check for explicitly set clr target property.
  if (cmValue clr = this->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
    return this->CheckManagedType(*clr);
  }

  // C# targets are always managed. This language specific check
  // is added to avoid that the COMMON_LANGUAGE_RUNTIME target property
  // has to be set manually for C# targets.
  return this->IsCSharpOnly() ? ManagedType::Managed : ManagedType::Native;
}